

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByLowercaseName(Descriptor *this,string *key)

{
  bool bVar1;
  Descriptor *in_RDI;
  FieldDescriptor *result;
  FileDescriptorTables *in_stack_00000020;
  FieldDescriptor *local_8;
  
  file(in_RDI);
  local_8 = FileDescriptorTables::FindFieldByLowercaseName(in_stack_00000020,this,key);
  if ((local_8 == (FieldDescriptor *)0x0) || (bVar1 = FieldDescriptor::is_extension(local_8), bVar1)
     ) {
    local_8 = (FieldDescriptor *)0x0;
  }
  return local_8;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByLowercaseName(
    const std::string& key) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByLowercaseName(this, key);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}